

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topo_data.hpp
# Opt level: O3

void __thiscall topo_data::topo_data(topo_data *this,MPI_Comm mpi_comm)

{
  int iVar1;
  undefined8 in_RAX;
  char *__nptr;
  int num_procs;
  int rank;
  undefined8 local_18;
  
  local_18 = in_RAX;
  MPI_Comm_rank(mpi_comm,(long)&local_18 + 4);
  MPI_Comm_size(mpi_comm,&local_18);
  __nptr = getenv("PPN");
  this->ppn = 0x10;
  if (__nptr == (char *)0x0) {
    iVar1 = 0x10;
  }
  else {
    iVar1 = atoi(__nptr);
    this->ppn = iVar1;
  }
  this->num_nodes = ((int)local_18 + -1) / iVar1 + 1;
  this->rank_ordering = 1;
  this->rank_node = (int)((long)local_18._4_4_ / (long)iVar1);
  MPI_Comm_split(mpi_comm,(long)local_18._4_4_ / (long)iVar1 & 0xffffffff,local_18._4_4_,
                 &this->local_comm);
  return;
}

Assistant:

topo_data(MPI_Comm mpi_comm)
    {
        int rank, num_procs;
        MPI_Comm_rank(mpi_comm, &rank);
        MPI_Comm_size(mpi_comm, &num_procs);

#ifdef USING_MPI3
        MPI_Comm_split_type(mpi_comm, MPI_COMM_TYPE_SHARED, rank, MPI_INFO_NULL, &local_comm);

        // Determine processes per node
        MPI_Comm_size(local_comm, &ppn);

        // Determine number of nodes
        // Assuming num_nodes divides num_procs evenly
        num_nodes = ((num_procs-1) / ppn) + 1;
#else
        char* ppn_char = getenv("PPN");
        ppn = 16;
        if (ppn_char)
        {
            ppn = atoi(ppn_char);
        }
        num_nodes = ((num_procs-1) / ppn) + 1;
#endif
        rank_ordering = get_ordering();  // If not Cray or BGQ, assuming SMP style order
        rank_node = get_node(rank, rank_ordering, num_nodes, ppn);

#ifndef USING_MPI3
        MPI_Comm_split(mpi_comm, rank_node, rank, &local_comm);
#endif
    }